

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
spirv_cross::SPIRFunction::SPIRFunction
          (SPIRFunction *this,TypeID return_type_,TypeID function_type_)

{
  SPIRFunction *this_local;
  TypeID function_type__local;
  TypeID return_type__local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRFunction_007518b8;
  *(uint32_t *)&(this->super_IVariant).field_0xc = return_type_.id;
  (this->function_type).id = function_type_.id;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::SmallVector(&this->arguments);
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::SmallVector(&this->shadow_arguments);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::SmallVector(&this->local_variables)
  ;
  TypedID<(spirv_cross::Types)6>::TypedID(&this->entry_block,0);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL>::SmallVector(&this->blocks);
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::SmallVector
            (&this->combined_parameters);
  EntryLine::EntryLine(&this->entry_line);
  SmallVector<std::function<void_()>,_0UL>::SmallVector(&this->fixup_hooks_out);
  SmallVector<std::function<void_()>,_0UL>::SmallVector(&this->fixup_hooks_in);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::SmallVector
            (&this->constant_arrays_needed_on_stack);
  this->active = false;
  this->flush_undeclared = true;
  this->do_combined_parameters = true;
  return;
}

Assistant:

SPIRFunction(TypeID return_type_, TypeID function_type_)
	    : return_type(return_type_)
	    , function_type(function_type_)
	{
	}